

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O3

void __thiscall dgGoogol::ShiftRightMantissa(dgGoogol *this,HaU64 *mantissa,HaI32 bits)

{
  HaU64 HVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  HaU64 HVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  
  HVar1 = *mantissa;
  if (0x3f < bits) {
    uVar5 = bits;
    do {
      HVar4 = mantissa[1];
      mantissa[3] = mantissa[2];
      bits = uVar5 - 0x40;
      mantissa[1] = *mantissa;
      mantissa[2] = HVar4;
      *mantissa = (long)HVar1 >> 0x3f;
      bVar2 = 0x7f < uVar5;
      uVar5 = bits;
    } while (bVar2);
  }
  if (0 < bits) {
    auVar8 = vpbroadcastq_avx512vl();
    auVar6 = vpbroadcastq_avx512vl();
    auVar7 = vpbroadcastq_avx512vl();
    auVar8 = valignq_avx512vl(*(undefined1 (*) [32])mantissa,auVar8,3);
    auVar3 = vpsrlq_avx2(*(undefined1 (*) [32])mantissa,auVar6);
    auVar8 = vpsllq_avx2(auVar8,auVar7);
    auVar8 = vpor_avx2(auVar3,auVar8);
    *(undefined1 (*) [32])mantissa = auVar8;
  }
  return;
}

Assistant:

void dgGoogol::ShiftRightMantissa (hacd::HaU64* const mantissa, hacd::HaI32 bits) const
{
	hacd::HaU64 carrier = 0;
	if (hacd::HaI64 (mantissa[0]) < hacd::HaI64 (0)) {
		carrier = hacd::HaU64 (-1);
	}
	
	while (bits >= 64) {
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 2; i >= 0; i --) {
			mantissa[i + 1] = mantissa[i];
		}
		mantissa[0] = carrier;
		bits -= 64;
	}

	if (bits > 0) {
		carrier <<= (64 - bits);
		for (hacd::HaI32 i = 0; i < DG_GOOGOL_SIZE; i ++) {
			hacd::HaU64 a = mantissa[i];
			mantissa[i] = (a >> bits) | carrier;
			carrier = a << (64 - bits);
		}
	}
}